

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int pager_link_page(Pager *pPager,Page *pPage)

{
  uint uVar1;
  Page *pPVar2;
  Page *pPVar3;
  uint uVar4;
  sxu32 sVar5;
  Page **ppPVar6;
  Page **ppPVar7;
  Page **ppPVar8;
  bool bVar9;
  
  uVar1 = pPager->nSize;
  uVar4 = uVar1 - 1 & (uint)pPage->pgno;
  ppPVar8 = pPager->apHash;
  pPVar2 = ppPVar8[uVar4];
  pPage->pNextCollide = pPVar2;
  if (pPVar2 != (Page *)0x0) {
    pPVar2->pPrevCollide = pPage;
  }
  ppPVar8[uVar4] = pPage;
  pPVar2 = pPager->pAll;
  if (pPVar2 != (Page *)0x0) {
    pPage->pNext = pPVar2;
    pPVar2->pPrev = pPage;
  }
  pPager->pAll = pPage;
  uVar4 = pPager->nPage + 1;
  pPager->nPage = uVar4;
  bVar9 = uVar4 < uVar1 * 4;
  ppPVar8 = (Page **)(ulong)CONCAT31((int3)(uVar4 >> 8),99999 < uVar4 || bVar9);
  if (99999 >= uVar4 && !bVar9) {
    ppPVar6 = (Page **)SyMemBackendAlloc(pPager->pAllocator,uVar1 << 4);
    ppPVar8 = ppPVar6;
    if (ppPVar6 != (Page **)0x0) {
      if ((uVar1 & 0xfffffff) != 0) {
        ppPVar7 = (Page **)((long)ppPVar6 + (ulong)(uVar1 << 4));
        do {
          *(undefined1 *)ppPVar8 = 0;
          if (ppPVar7 <= (Page **)((long)ppPVar8 + 1)) break;
          *(undefined1 *)((long)ppPVar8 + 1) = 0;
          if (ppPVar7 <= (Page **)((long)ppPVar8 + 2)) break;
          *(undefined1 *)((long)ppPVar8 + 2) = 0;
          if (ppPVar7 <= (Page **)((long)ppPVar8 + 3)) break;
          *(undefined1 *)((long)ppPVar8 + 3) = 0;
          ppPVar8 = (Page **)((long)ppPVar8 + 4);
        } while (ppPVar8 < ppPVar7);
      }
      sVar5 = pPager->nPage;
      if (sVar5 != 0) {
        ppPVar8 = &pPager->pAll;
        do {
          pPVar2 = *ppPVar8;
          pPVar2->pNextCollide = (Page *)0x0;
          pPVar2->pPrevCollide = (Page *)0x0;
          uVar4 = (uint)pPVar2->pgno & uVar1 * 2 - 1;
          pPVar3 = ppPVar6[uVar4];
          pPVar2->pNextCollide = pPVar3;
          if (pPVar3 != (Page *)0x0) {
            pPVar3->pPrevCollide = pPVar2;
          }
          ppPVar6[uVar4] = pPVar2;
          ppPVar8 = &pPVar2->pNext;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      uVar4 = SyMemBackendFree(pPager->pAllocator,pPager->apHash);
      ppPVar8 = (Page **)(ulong)uVar4;
      pPager->apHash = ppPVar6;
      pPager->nSize = uVar1 * 2;
    }
  }
  return (int)ppPVar8;
}

Assistant:

static int pager_link_page(Pager *pPager,Page *pPage)
{
	sxu32 nBucket;
	/* Install in the corresponding bucket */
	nBucket = PAGE_HASH(pPage->pgno) & (pPager->nSize - 1);
	pPage->pNextCollide = pPager->apHash[nBucket];
	if( pPager->apHash[nBucket] ){
		pPager->apHash[nBucket]->pPrevCollide = pPage;
	}
	pPager->apHash[nBucket] = pPage;
	/* Link to the list of active pages */
	MACRO_LD_PUSH(pPager->pAll,pPage);
	pPager->nPage++;
	if( (pPager->nPage >= pPager->nSize * 4)  && pPager->nPage < 100000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = pPager->nSize << 1;
		Page *pEntry,**apNew;
		sxu32 n;
		apNew = (Page **)SyMemBackendAlloc(pPager->pAllocator, nNewSize * sizeof(Page *));
		if( apNew ){
			sxu32 iBucket;
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(Page *));
			/* Rehash all entries */
			n = 0;
			pEntry = pPager->pAll;
			for(;;){
				/* Loop one */
				if( n >= pPager->nPage ){
					break;
				}
				pEntry->pNextCollide = pEntry->pPrevCollide = 0;
				/* Install in the new bucket */
				iBucket = PAGE_HASH(pEntry->pgno) & (nNewSize - 1);
				pEntry->pNextCollide = apNew[iBucket];
				if( apNew[iBucket] ){
					apNew[iBucket]->pPrevCollide = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(pPager->pAllocator,(void *)pPager->apHash);
			pPager->apHash = apNew;
			pPager->nSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}